

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_file.c
# Opt level: O3

char * ngx_conf_set_path_slot(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  ngx_uint_t nVar1;
  void *pvVar2;
  ngx_conf_file_t *pnVar3;
  u_char *puVar4;
  ngx_path_t *name;
  ngx_int_t nVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ngx_path_t **slot;
  undefined8 *puVar11;
  char *pcVar12;
  
  nVar1 = cmd->offset;
  if (*(long *)((long)conf + nVar1) == 0) {
    name = (ngx_path_t *)ngx_pcalloc(cf->pool,0x60);
    pcVar12 = (char *)0xffffffffffffffff;
    if (name != (ngx_path_t *)0x0) {
      pvVar2 = cf->args->elts;
      puVar4 = *(u_char **)((long)pvVar2 + 0x18);
      (name->name).len = *(size_t *)((long)pvVar2 + 0x10);
      (name->name).data = puVar4;
      sVar6 = (name->name).len;
      if ((name->name).data[sVar6 - 1] == '/') {
        (name->name).len = sVar6 - 1;
      }
      nVar5 = ngx_conf_full_name(cf->cycle,(ngx_str_t *)name,0);
      if (nVar5 == 0) {
        pnVar3 = cf->conf_file;
        name->conf_file = (pnVar3->file).name.data;
        name->line = pnVar3->line;
        pcVar12 = "invalid value";
        if (cf->args->nelts < 3) {
          uVar8 = name->len;
          uVar7 = 10;
        }
        else {
          puVar11 = (undefined8 *)((long)pvVar2 + 0x28);
          uVar9 = 10;
          do {
            sVar6 = ngx_atoi((u_char *)*puVar11,puVar11[-1]);
            if (sVar6 + 1 < 2) {
              return pcVar12;
            }
            name->level[uVar9 - 10] = sVar6;
            uVar8 = sVar6 + 1 + name->len;
            name->len = uVar8;
            uVar7 = uVar9 + 1;
            uVar10 = uVar9 - 7;
            puVar11 = puVar11 + 2;
            uVar9 = uVar7;
          } while (uVar10 < cf->args->nelts);
        }
        if (uVar8 <= uVar7) {
          slot = (ngx_path_t **)((long)conf + nVar1);
          *slot = name;
          nVar5 = ngx_add_path(cf,slot);
          pcVar12 = (char *)-(ulong)(nVar5 == -1);
        }
      }
    }
  }
  else {
    pcVar12 = "is duplicate";
  }
  return pcVar12;
}

Assistant:

char *
ngx_conf_set_path_slot(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    char  *p = conf;

    ssize_t      level;
    ngx_str_t   *value;
    ngx_uint_t   i, n;
    ngx_path_t  *path, **slot;

    slot = (ngx_path_t **) (p + cmd->offset);

    if (*slot) {
        return "is duplicate";
    }

    path = ngx_pcalloc(cf->pool, sizeof(ngx_path_t));
    if (path == NULL) {
        return NGX_CONF_ERROR;
    }

    value = cf->args->elts;

    path->name = value[1];

    if (path->name.data[path->name.len - 1] == '/') {
        path->name.len--;
    }

    if (ngx_conf_full_name(cf->cycle, &path->name, 0) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    path->conf_file = cf->conf_file->file.name.data;
    path->line = cf->conf_file->line;

    for (i = 0, n = 2; n < cf->args->nelts; i++, n++) {
        level = ngx_atoi(value[n].data, value[n].len);
        if (level == NGX_ERROR || level == 0) {
            return "invalid value";
        }

        path->level[i] = level;
        path->len += level + 1;
    }

    if (path->len > 10 + i) {
        return "invalid value";
    }

    *slot = path;

    if (ngx_add_path(cf, slot) == NGX_ERROR) {
        return NGX_CONF_ERROR;
    }

    return NGX_CONF_OK;
}